

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void traverse_tree_sim<PredictionData<double,unsigned_long>,double>
               (WorkerForSimilarity *workspace,
               PredictionData<double,_unsigned_long> *prediction_data,IsoForest *model_outputs,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,size_t curr_tree,bool as_kernel)

{
  int iVar1;
  MissingAction MVar2;
  pointer pIVar3;
  double *pdVar4;
  double *pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  size_t sVar8;
  pointer puVar9;
  size_t sVar10;
  pointer puVar11;
  char *split_categ;
  char *pcVar12;
  pointer pdVar13;
  unsigned_long uVar14;
  size_t row;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var15;
  ulong uVar16;
  size_t sVar17;
  size_t *psVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  size_t j_1;
  size_t j;
  long lVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  size_t end_NA;
  size_t st_NA;
  size_t split_ix;
  long local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  
  if (interrupt_switch) {
    return;
  }
  sVar17 = workspace->st;
  sVar24 = workspace->end;
  if (sVar17 == sVar24) {
    return;
  }
  if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar11 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar11 + sVar17,puVar11 + sVar24 + 1);
    puVar11 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar17 = workspace->st;
    if (workspace->n_from <= puVar11[sVar17]) {
      return;
    }
    sVar24 = workspace->end;
    if (puVar11[sVar24] < workspace->n_from) {
      return;
    }
  }
  pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = curr_tree * 0x70;
  if (pIVar3[curr_tree].tree_left == 0) {
    dVar28 = pIVar3[curr_tree].remainder;
    pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pdVar13 !=
        (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (!as_kernel) {
        if (workspace->assume_full_distr == false) {
          puVar11 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar26 = std::
                   accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double,traverse_tree_sim<PredictionData<double,unsigned_long>,double>(WorkerForSimilarity&,PredictionData<double,unsigned_long>&,IsoForest&,std::vector<IsoTree,std::allocator<IsoTree>>&,unsigned_long,bool)::_lambda(double,unsigned_long)_1_>
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )(puVar11 + sVar17),
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )(puVar11 + sVar24),0.0,(anon_class_8_1_57b07335)workspace);
          dVar28 = dVar28 + dVar26;
        }
        pdVar4 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar4 == (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pdVar4 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            return;
          }
          psVar18 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar17 = workspace->st;
          sVar24 = workspace->end;
          sVar8 = workspace->n_from;
          sVar10 = prediction_data->nrows;
          pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (workspace->assume_full_distr == false) {
            dVar28 = expected_separation_depth<double>(dVar28);
          }
          else {
            dVar28 = 3.0;
          }
          increase_comb_counter_in_groups(psVar18,sVar17,sVar24,sVar8,sVar10,pdVar4,pdVar5,dVar28);
          return;
        }
        psVar18 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar17 = workspace->st;
        sVar24 = workspace->end;
        sVar8 = prediction_data->nrows;
        pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (workspace->assume_full_distr == false) {
          dVar28 = expected_separation_depth<double>(dVar28);
        }
        else {
          dVar28 = 3.0;
        }
        increase_comb_counter(psVar18,sVar17,sVar24,sVar8,pdVar4,pdVar5,dVar28);
        return;
      }
      pdVar6 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar6 != pdVar7) {
        puVar11 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar19 = (long)pdVar7 - (long)pdVar6 >> 3;
        while (sVar17 < sVar24) {
          uVar20 = puVar11[sVar17];
          dVar28 = pdVar13[uVar20];
          sVar8 = prediction_data->nrows;
          lVar22 = sVar8 - uVar20;
          sVar17 = sVar17 + 1;
          for (uVar25 = sVar17; uVar25 <= sVar24; uVar25 = uVar25 + 1) {
            uVar16 = puVar11[uVar25];
            if (uVar20 < uVar16) {
              lVar21 = (lVar19 - uVar20) + uVar16 + ~((ulong)((lVar22 + -1) * lVar22) >> 1);
            }
            else {
              lVar21 = sVar8 - uVar16;
              lVar21 = ((uVar20 + lVar19) - uVar16) + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
            }
            pdVar6[lVar21] = pdVar13[uVar16] * dVar28 + pdVar6[lVar21];
          }
        }
        return;
      }
      if ((workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = puVar9 + sVar17;
      _Var15 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar11,puVar9 + sVar24 + 1,&workspace->n_from);
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = workspace->st;
      uVar16 = ((long)_Var15._M_current - (long)puVar11 >> 3) + uVar20;
      pdVar13 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar17 = workspace->n_from;
      pdVar6 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar25 = workspace->end;
      for (; uVar20 < uVar16; uVar20 = uVar20 + 1) {
        uVar14 = puVar9[uVar20];
        lVar19 = sVar17 * uVar14;
        dVar28 = pdVar6[uVar14];
        for (uVar23 = uVar16; uVar23 <= uVar25; uVar23 = uVar23 + 1) {
          uVar14 = puVar9[uVar23];
          lVar22 = uVar14 - sVar17;
          pdVar13[lVar19 + lVar22] = pdVar6[uVar14] * dVar28 + pdVar13[lVar19 + lVar22];
        }
      }
      return;
    }
    if (!as_kernel) {
      lVar19 = (sVar24 - sVar17) + 1;
      auVar27._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar27._0_8_ = lVar19;
      auVar27._12_4_ = 0x45300000;
      dVar28 = dVar28 + (auVar27._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
      pdVar4 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4 != (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        psVar18 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar8 = prediction_data->nrows;
        if (workspace->assume_full_distr == false) {
          dVar28 = expected_separation_depth<double>(dVar28);
        }
        else {
          dVar28 = 3.0;
        }
        increase_comb_counter(psVar18,sVar17,sVar24,sVar8,pdVar4,dVar28);
        return;
      }
      pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      psVar18 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar8 = workspace->n_from;
      sVar10 = prediction_data->nrows;
      if (workspace->assume_full_distr == false) {
        dVar28 = expected_separation_depth<double>(dVar28);
      }
      else {
        dVar28 = 3.0;
      }
      increase_comb_counter_in_groups(psVar18,sVar17,sVar24,sVar8,sVar10,pdVar4,dVar28);
      return;
    }
    pdVar13 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar6 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar13 != pdVar6) {
      puVar11 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar19 = (long)pdVar6 - (long)pdVar13 >> 3;
      while (sVar17 < sVar24) {
        uVar20 = puVar11[sVar17];
        sVar8 = prediction_data->nrows;
        lVar22 = sVar8 - uVar20;
        sVar17 = sVar17 + 1;
        for (uVar25 = sVar17; uVar25 <= sVar24; uVar25 = uVar25 + 1) {
          uVar16 = puVar11[uVar25];
          if (uVar20 < uVar16) {
            lVar21 = uVar16 + (lVar19 - uVar20) + ~((ulong)((lVar22 + -1) * lVar22) >> 1);
          }
          else {
            lVar21 = sVar8 - uVar16;
            lVar21 = ((uVar20 + lVar19) - uVar16) + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
          }
          pdVar13[lVar21] = pdVar13[lVar21] + 1.0;
        }
      }
      return;
    }
    if ((workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar11 = puVar9 + sVar17;
    _Var15 = std::
             __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar11,puVar9 + sVar24 + 1,&workspace->n_from);
    puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar20 = workspace->st;
    uVar16 = ((long)_Var15._M_current - (long)puVar11 >> 3) + uVar20;
    pdVar13 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar17 = workspace->n_from;
    uVar25 = workspace->end;
    for (; uVar20 < uVar16; uVar20 = uVar20 + 1) {
      lVar19 = puVar9[uVar20] * sVar17;
      for (uVar23 = uVar16; uVar23 <= uVar25; uVar23 = uVar23 + 1) {
        lVar22 = puVar9[uVar23] - sVar17;
        pdVar13[lVar19 + lVar22] = pdVar13[lVar19 + lVar22] + 1.0;
      }
    }
    return;
  }
  if (curr_tree != 0 && !as_kernel) {
    pdVar4 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar4 == (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4 != (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        psVar18 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pdVar5 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          increase_comb_counter_in_groups
                    (psVar18,sVar17,sVar24,workspace->n_from,prediction_data->nrows,pdVar4,-1.0);
        }
        else {
          increase_comb_counter_in_groups
                    (psVar18,sVar17,sVar24,workspace->n_from,prediction_data->nrows,pdVar4,pdVar5,
                     -1.0);
        }
      }
    }
    else {
      psVar18 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar5 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        increase_comb_counter(psVar18,sVar17,sVar24,prediction_data->nrows,pdVar4,-1.0);
      }
      else {
        increase_comb_counter(psVar18,sVar17,sVar24,prediction_data->nrows,pdVar4,pdVar5,-1.0);
      }
    }
  }
  if ((prediction_data->Xc_indptr != (unsigned_long *)0x0) &&
     ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    puVar11 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar11 + workspace->st,puVar11 + workspace->end + 1);
  }
  lVar19 = local_80;
  pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = *(int *)((long)&pIVar3->col_type + local_80);
  if (iVar1 == 0x20) {
    if (model_outputs->cat_split_type == SubSet) {
      split_categ = *(char **)((long)&(pIVar3->cat_split).
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl + local_80);
      pcVar12 = *(char **)((long)&(pIVar3->cat_split).
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl + local_80 + 8);
      if (pcVar12 == split_categ) {
        pdVar4 = (double *)((long)&pIVar3->pct_tree_left + local_80);
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            *(long *)((long)&pIVar3->col_num + local_80) * prediction_data->nrows,
                            workspace->st,workspace->end,model_outputs->missing_action,
                            model_outputs->new_cat_action,*pdVar4 <= 0.5 && *pdVar4 != 0.5,&st_NA,
                            &end_NA,&split_ix);
      }
      else {
        pdVar4 = (double *)((long)&pIVar3->pct_tree_left + local_80);
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            *(long *)((long)&pIVar3->col_num + local_80) * prediction_data->nrows,
                            workspace->st,workspace->end,split_categ,(int)pcVar12 - (int)split_categ
                            ,model_outputs->missing_action,model_outputs->new_cat_action,
                            *pdVar4 <= 0.5 && *pdVar4 != 0.5,&st_NA,&end_NA,&split_ix);
      }
    }
    else if (model_outputs->cat_split_type == SingleCateg) {
      divide_subset_split((workspace->ix_arr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          prediction_data->categ_data +
                          *(long *)((long)&pIVar3->col_num + local_80) * prediction_data->nrows,
                          workspace->st,workspace->end,
                          *(int *)((long)&pIVar3->chosen_cat + local_80),
                          model_outputs->missing_action,&st_NA,&end_NA,&split_ix);
    }
  }
  else if (iVar1 == 0x1f) {
    psVar18 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (prediction_data->Xc_indptr == (unsigned_long *)0x0) {
      divide_subset_split<double>
                (psVar18,prediction_data->numeric_data +
                         *(long *)((long)&pIVar3->col_num + local_80) * prediction_data->nrows,
                 workspace->st,workspace->end,*(double *)((long)&pIVar3->num_split + local_80),
                 model_outputs->missing_action,&st_NA,&end_NA,&split_ix);
    }
    else {
      divide_subset_split<double,unsigned_long>
                (psVar18,workspace->st,workspace->end,*(size_t *)((long)&pIVar3->col_num + local_80)
                 ,prediction_data->Xc,prediction_data->Xc_ind,prediction_data->Xc_indptr,
                 *(double *)((long)&pIVar3->num_split + local_80),model_outputs->missing_action,
                 &st_NA,&end_NA,&split_ix);
    }
  }
  uVar20 = workspace->end;
  MVar2 = model_outputs->missing_action;
  if (((model_outputs->new_cat_action == Weighted) && (model_outputs->cat_split_type == SubSet)) &&
     (prediction_data->categ_data != (int *)0x0)) {
    if ((MVar2 == Fail) &&
       (*(int *)((long)&((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                         super__Vector_impl_data._M_start)->col_type + lVar19) == 0x1f)) {
      st_NA = split_ix;
      end_NA = split_ix;
    }
LAB_00229bdb:
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar25 = workspace->st;
    if (uVar25 < end_NA) {
      pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      std::vector<double,std::allocator<double>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((vector<double,std::allocator<double>> *)&weights_arr,pdVar13,pdVar13 + end_NA);
      puVar11 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ix_arr,puVar11,
                 puVar11 + end_NA);
      uVar25 = workspace->st;
    }
    if (uVar25 < end_NA) {
      workspace->end = end_NA - 1;
      pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar11 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      for (sVar17 = st_NA; sVar17 < end_NA; sVar17 = sVar17 + 1) {
        uVar14 = puVar11[sVar17];
        pdVar13[uVar14] = *(double *)((long)&pIVar3->pct_tree_left + lVar19) * pdVar13[uVar14];
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 *(size_t *)((long)&pIVar3->tree_left + lVar19),as_kernel);
    }
    if (st_NA <= uVar20) {
      workspace->st = st_NA;
      workspace->end = uVar20;
      if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start,
                weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
        if ((long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          memmove((workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&weights_arr);
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(&ix_arr);
      }
      pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar11 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      for (sVar17 = st_NA; sVar17 < end_NA; sVar17 = sVar17 + 1) {
        uVar14 = puVar11[sVar17];
        pdVar13[uVar14] =
             (1.0 - *(double *)((long)&pIVar3->pct_tree_left + lVar19)) * pdVar13[uVar14];
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 *(size_t *)
                  ((long)&((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                           super__Vector_impl_data._M_start)->tree_right + lVar19),as_kernel);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&weights_arr.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    if (MVar2 == Impute) {
      psVar18 = &st_NA;
      if (0.5 <= *(double *)
                  ((long)&((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                           super__Vector_impl_data._M_start)->pct_tree_left + lVar19)) {
        psVar18 = &end_NA;
      }
      split_ix = *psVar18;
    }
    else {
      if (MVar2 == Divide) goto LAB_00229bdb;
      if (MVar2 != Fail) {
        return;
      }
    }
    if (workspace->st < split_ix) {
      workspace->end = split_ix - 1;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 *(size_t *)
                  ((long)&((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                           super__Vector_impl_data._M_start)->tree_left + lVar19),as_kernel);
    }
    if (split_ix <= uVar20) {
      workspace->st = split_ix;
      workspace->end = uVar20;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 *(size_t *)
                  ((long)&((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                           super__Vector_impl_data._M_start)->tree_right + lVar19),as_kernel);
    }
  }
  return;
}

Assistant:

void traverse_tree_sim(WorkerForSimilarity   &workspace,
                       PredictionData        &prediction_data,
                       IsoForest             &model_outputs,
                       std::vector<IsoTree>  &trees,
                       size_t                curr_tree,
                       const bool            as_kernel)
{
    if (interrupt_switch)
        return;

    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (trees[curr_tree].tree_left == 0)
    {
        ldouble_safe rem = (ldouble_safe) trees[curr_tree].remainder;
        if (workspace.weights_arr.empty())
        {
            if (!as_kernel)
            {
                rem += (ldouble_safe)(workspace.end - workspace.st + 1);
                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows, workspace.rmat.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                        }
                    }
                }
            }
        }

        else
        {
            if (!as_kernel)
            {
                if (!workspace.assume_full_distr)
                {
                    rem += std::accumulate(workspace.ix_arr.begin() + workspace.st,
                                           workspace.ix_arr.begin() + workspace.end,
                                           (ldouble_safe) 0.,
                                           [&workspace](ldouble_safe curr, size_t ix)
                                           {return curr + (ldouble_safe)workspace.weights_arr[ix];}
                                          );
                }

                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.weights_arr.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows,
                                                    workspace.rmat.data(), workspace.weights_arr.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    double w_this;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    double w_this;
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        rmat_this = workspace.rmat.data() + i_*workspace.n_from;
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            rmat_this[j_ - workspace.n_from]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(), -1.);
            else
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.weights_arr.data(), -1.);
        }
        else if (!workspace.rmat.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows, workspace.rmat.data(), -1.);
            else
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows,
                                                workspace.rmat.data(), workspace.weights_arr.data(), -1.);
        }
    }


    /* divide according to tree */
    if (prediction_data.Xc_indptr != NULL && !workspace.tmat_sep.empty())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            if (prediction_data.Xc_indptr == NULL)
                divide_subset_split(workspace.ix_arr.data(),
                                    prediction_data.numeric_data + prediction_data.nrows * trees[curr_tree].col_num,
                                    workspace.st, workspace.end, trees[curr_tree].num_split,
                                    model_outputs.missing_action, st_NA, end_NA, split_ix);
            else
                divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    trees[curr_tree].num_split, model_outputs.missing_action,
                                    st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch(model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }


    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL) {
        if (model_outputs.missing_action == Fail && trees[curr_tree].col_type == Numeric) {
            st_NA = split_ix;
            end_NA = split_ix;
        }
        goto missing_action_divide;
    }
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }

        case Divide: /* new_cat_action = 'Weighted' will also fall here */
        {
            /* TODO: this one should also have a parameter 'changed_weoghts' like during fitting */
            missing_action_divide:
          /* TODO: maybe here it shouldn't copy the whole ix_arr,
             but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.begin(),
                              workspace.ix_arr.begin() + end_NA);
            }

            if (end_NA > workspace.st)
            {
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }

            if (st_NA <= orig_end)
            {
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (!weights_arr.empty())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }
    }
}